

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvparser.cc
# Opt level: O1

bool __thiscall mkvparser::Tags::ExpandTagsArray(Tags *this)

{
  int iVar1;
  int iVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  Tag *pTVar7;
  Tag *pTVar8;
  bool bVar9;
  
  iVar1 = this->m_tags_size;
  bVar9 = true;
  if (iVar1 <= this->m_tags_count) {
    iVar2 = 1;
    if (iVar1 != 0) {
      iVar2 = iVar1 * 2;
    }
    lVar6 = (long)iVar2 * 0x10;
    uVar5 = 0xffffffffffffffff;
    if (-1 < iVar2) {
      uVar5 = lVar6 + 8;
    }
    plVar3 = (long *)operator_new__(uVar5,(nothrow_t *)&std::nothrow);
    if (plVar3 == (long *)0x0) {
      pTVar7 = (Tag *)0x0;
    }
    else {
      *plVar3 = (long)iVar2;
      pTVar7 = (Tag *)(plVar3 + 1);
      lVar4 = 0;
      pTVar8 = pTVar7;
      do {
        Tag::Tag(pTVar8);
        lVar4 = lVar4 + -0x10;
        pTVar8 = pTVar8 + 1;
      } while (-lVar4 != lVar6);
    }
    bVar9 = pTVar7 != (Tag *)0x0;
    if (bVar9) {
      iVar1 = this->m_tags_count;
      if (0 < (long)iVar1) {
        pTVar8 = this->m_tags;
        lVar6 = 0;
        do {
          *(undefined8 *)((long)&pTVar7->m_simple_tags + lVar6) =
               *(undefined8 *)((long)&pTVar8->m_simple_tags + lVar6);
          *(undefined8 *)((long)&pTVar7->m_simple_tags_size + lVar6) =
               *(undefined8 *)((long)&pTVar8->m_simple_tags_size + lVar6);
          lVar6 = lVar6 + 0x10;
        } while ((long)iVar1 * 0x10 != lVar6);
      }
      pTVar8 = this->m_tags;
      if (pTVar8 != (Tag *)0x0) {
        lVar6._0_4_ = pTVar8[-1].m_simple_tags_size;
        lVar6._4_4_ = pTVar8[-1].m_simple_tags_count;
        if (lVar6 != 0) {
          lVar6 = lVar6 << 4;
          do {
            Tag::~Tag((Tag *)((long)&pTVar8[-1].m_simple_tags + lVar6));
            lVar6 = lVar6 + -0x10;
          } while (lVar6 != 0);
        }
        operator_delete__(&pTVar8[-1].m_simple_tags_size);
      }
      this->m_tags = pTVar7;
      this->m_tags_size = iVar2;
    }
  }
  return bVar9;
}

Assistant:

bool Tags::ExpandTagsArray() {
  if (m_tags_size > m_tags_count)
    return true;  // nothing else to do

  const int size = (m_tags_size == 0) ? 1 : 2 * m_tags_size;

  Tag* const tags = new (std::nothrow) Tag[size];

  if (tags == NULL)
    return false;

  for (int idx = 0; idx < m_tags_count; ++idx) {
    m_tags[idx].ShallowCopy(tags[idx]);
  }

  delete[] m_tags;
  m_tags = tags;

  m_tags_size = size;
  return true;
}